

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_ofb64.c
# Opt level: O0

void IDEA_ofb64_encrypt(uchar *in,uchar *out,long length,IDEA_KEY_SCHEDULE *schedule,uchar *ivec,
                       int *num)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  IDEA_KEY_SCHEDULE *in_RCX;
  long in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  byte *in_R8;
  uint *in_R9;
  int save;
  uchar *iv;
  unsigned_long ti [2];
  char *dp;
  uchar d [8];
  long l;
  int n;
  unsigned_long t;
  unsigned_long v1;
  unsigned_long v0;
  int local_84;
  ulong local_78;
  ulong local_70;
  long *local_68;
  byte local_60 [4];
  byte local_5c;
  byte local_5b;
  byte local_5a;
  byte local_59;
  long local_58;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  uint *local_30;
  byte *local_28;
  IDEA_KEY_SCHEDULE *local_20;
  byte *local_10;
  byte *local_8;
  
  local_4c = *in_R9;
  local_84 = 0;
  if ((int)*in_R9 < 0) {
    *in_R9 = 0xffffffff;
  }
  else {
    local_78 = (ulong)in_R8[3] |
               (ulong)in_R8[2] << 8 | (ulong)in_R8[1] << 0x10 | (ulong)*in_R8 << 0x18;
    local_38 = local_78;
    local_70 = (ulong)in_R8[7] |
               (ulong)in_R8[6] << 8 | (ulong)in_R8[5] << 0x10 | (ulong)in_R8[4] << 0x18;
    local_40 = local_70;
    local_60[0] = *in_R8;
    local_60[1] = in_R8[1];
    local_60[2] = in_R8[2];
    local_60[3] = in_R8[3];
    local_5c = in_R8[4];
    local_5b = in_R8[5];
    local_5a = in_R8[6];
    local_59 = in_R8[7];
    local_58 = in_RDX;
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    while (lVar1 = local_58, local_68 = &local_58, local_58 = local_58 + -1, lVar1 != 0) {
      if (local_4c == 0) {
        IDEA_encrypt(&local_78,local_20);
        local_60[0] = (byte)(local_78 >> 0x18);
        local_60[1] = (byte)(local_78 >> 0x10);
        local_60[2] = (byte)(local_78 >> 8);
        local_60[3] = (byte)local_78;
        local_48 = local_70;
        local_5c = (byte)(local_70 >> 0x18);
        local_5b = (byte)(local_70 >> 0x10);
        local_5a = (byte)(local_70 >> 8);
        local_59 = (byte)local_70;
        local_84 = local_84 + 1;
      }
      pbVar3 = local_8;
      pbVar2 = local_10;
      local_8 = local_8 + 1;
      local_10 = local_10 + 1;
      *pbVar2 = *pbVar3 ^ local_60[(int)local_4c];
      local_4c = local_4c + 1 & 7;
    }
    if (local_84 != 0) {
      *local_28 = (byte)(local_78 >> 0x18);
      local_28[1] = (byte)(local_78 >> 0x10);
      local_28[2] = (byte)(local_78 >> 8);
      local_28[3] = (byte)local_78;
      local_28[4] = (byte)(local_70 >> 0x18);
      local_28[5] = (byte)(local_70 >> 0x10);
      local_28[6] = (byte)(local_70 >> 8);
      local_28[7] = (byte)local_70;
    }
    *local_30 = local_4c;
  }
  return;
}

Assistant:

void IDEA_ofb64_encrypt(const unsigned char *in, unsigned char *out,
                        long length, IDEA_KEY_SCHEDULE *schedule,
                        unsigned char *ivec, int *num)
{
    register unsigned long v0, v1, t;
    register int n = *num;
    register long l = length;
    unsigned char d[8];
    register char *dp;
    unsigned long ti[2];
    unsigned char *iv;
    int save = 0;

    if (n < 0) {
        *num = -1;
        return;
    }

    iv = (unsigned char *)ivec;
    n2l(iv, v0);
    n2l(iv, v1);
    ti[0] = v0;
    ti[1] = v1;
    dp = (char *)d;
    l2n(v0, dp);
    l2n(v1, dp);
    while (l--) {
        if (n == 0) {
            IDEA_encrypt((unsigned long *)ti, schedule);
            dp = (char *)d;
            t = ti[0];
            l2n(t, dp);
            t = ti[1];
            l2n(t, dp);
            save++;
        }
        *(out++) = *(in++) ^ d[n];
        n = (n + 1) & 0x07;
    }
    if (save) {
        v0 = ti[0];
        v1 = ti[1];
        iv = (unsigned char *)ivec;
        l2n(v0, iv);
        l2n(v1, iv);
    }
    t = v0 = v1 = ti[0] = ti[1] = 0;
    *num = n;
}